

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

int Search::random_policy
              (search_private *priv,bool allow_current,bool allow_optimal,bool advance_prng)

{
  float fVar1;
  uint64_t *puVar2;
  uint uVar3;
  uint32_t uVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  
  uVar4 = priv->current_policy;
  if (1.0 <= priv->beta) {
    if (allow_current) {
      return uVar4;
    }
    if (uVar4 != 0) {
      return uVar4 - 1;
    }
    if (allow_optimal) {
      return -1;
    }
LAB_00249d30:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "internal error (bug): no valid policies to choose from!  defaulting to current",0x4e
              );
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    uVar4 = priv->current_policy;
  }
  else {
    iVar5 = (uint)allow_optimal + (uint)allow_current + uVar4;
    if (iVar5 == 2) {
      puVar2 = &priv->all->random_state;
      if (advance_prng) {
        fVar6 = merand48(puVar2);
      }
      else {
        fVar6 = merand48_noadvance(*puVar2);
      }
      uVar3 = (uint)(priv->beta <= fVar6);
    }
    else {
      uVar3 = 0;
      if (iVar5 != 1) {
        if (iVar5 == 0) goto LAB_00249d30;
        puVar2 = &priv->all->random_state;
        if (advance_prng) {
          fVar6 = merand48(puVar2);
        }
        else {
          fVar6 = merand48_noadvance(*puVar2);
        }
        if ((priv->beta < fVar6) &&
           (fVar6 = fVar6 - priv->beta, uVar3 = 0, 1 < iVar5 && 0.0 < fVar6)) {
          uVar3 = 0;
          do {
            uVar3 = uVar3 + 1;
            fVar1 = priv->beta;
            fVar7 = powf(1.0 - fVar1,(float)(int)uVar3);
            fVar6 = fVar6 - fVar7 * fVar1;
            if (fVar6 <= 0.0) break;
          } while ((int)uVar3 < iVar5 + -1);
        }
      }
    }
    if ((!allow_optimal) || (uVar4 = 0xffffffff, uVar3 != iVar5 - 1U)) {
      uVar4 = ~uVar3 + (uint)allow_current + priv->current_policy;
    }
  }
  return uVar4;
}

Assistant:

int random_policy(search_private& priv, bool allow_current, bool allow_optimal, bool advance_prng = true)
{
  if (priv.beta >= 1)
  {
    if (allow_current)
      return (int)priv.current_policy;
    if (priv.current_policy > 0)
      return (((int)priv.current_policy) - 1);
    if (allow_optimal)
      return -1;
    std::cerr << "internal error (bug): no valid policies to choose from!  defaulting to current" << std::endl;
    return (int)priv.current_policy;
  }

  int num_valid_policies = (int)priv.current_policy + allow_optimal + allow_current;
  int pid = -1;

  if (num_valid_policies == 0)
  {
    std::cerr << "internal error (bug): no valid policies to choose from!  defaulting to current" << std::endl;
    return (int)priv.current_policy;
  }
  else if (num_valid_policies == 1)
    pid = 0;
  else if (num_valid_policies == 2)
    pid = (advance_prng ? merand48(priv.all->random_state) : merand48_noadvance(priv.all->random_state)) >= priv.beta;
  else
  {
    // SPEEDUP this up in the case that beta is small!
    float r = (advance_prng ? merand48(priv.all->random_state) : merand48_noadvance(priv.all->random_state));
    pid = 0;

    if (r > priv.beta)
    {
      r -= priv.beta;
      while ((r > 0) && (pid < num_valid_policies - 1))
      {
        pid++;
        r -= priv.beta * powf(1.f - priv.beta, (float)pid);
      }
    }
  }
  // figure out which policy pid refers to
  if (allow_optimal && (pid == num_valid_policies - 1))
    return -1;  // this is the optimal policy

  pid = (int)priv.current_policy - pid;
  if (!allow_current)
    pid--;

  return pid;
}